

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

int set_vt_partitioning(AV1_COMP *cpi,MACROBLOCKD *xd,TileInfo *tile,void *data,BLOCK_SIZE bsize,
                       int mi_row,int mi_col,int64_t threshold,BLOCK_SIZE bsize_min,
                       PART_EVAL_STATUS force_split)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  VPVariance *pVVar3;
  BLOCK_SIZE bsize_00;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined7 in_register_00000081;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint local_84;
  variance_node vt;
  
  uVar10 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar6 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar10];
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar10];
  uVar5 = (uint)bVar1;
  uVar4 = (uint)bVar6;
  uVar11 = (uint)(bVar6 >> 1);
  uVar9 = (uint)(bVar1 >> 1);
  uVar12 = uVar11;
  local_84 = uVar9;
  if (((cpi->common).seq_params)->sb_size == BLOCK_64X64) {
    uVar4 = uVar11 + 1;
    uVar12 = (bVar6 >> 2) + 1;
    if (tile->mi_col_end != (cpi->common).mi_params.mi_cols) {
      uVar4 = (uint)bVar6;
      uVar12 = uVar11;
    }
    if (tile->mi_row_end == (cpi->common).mi_params.mi_rows) {
      uVar5 = uVar9 + 1;
      local_84 = (bVar1 >> 2) + 1;
    }
  }
  tree_to_node(data,bsize,&vt);
  iVar7 = uVar4 + mi_col;
  iVar8 = tile->mi_col_end;
  if (((iVar8 < iVar7) || (force_split != '\x02')) || (tile->mi_row_end < (int)(mi_row + uVar5))) {
    if (force_split == '\x01') {
      return 0;
    }
    if (bsize == bsize_min) {
      if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
        get_variance(&(vt.part_variances)->none);
        iVar8 = tile->mi_col_end;
      }
      if (iVar8 < iVar7) {
        return 0;
      }
      if (tile->mi_row_end < (int)(uVar5 + mi_row)) {
        return 0;
      }
      if (threshold <= ((vt.part_variances)->none).variance) {
        return 0;
      }
    }
    else {
      if (bsize <= bsize_min) {
        return 0;
      }
      bVar6 = (cpi->common).current_frame.frame_type;
      if ((bVar6 & 0xfd) == 0) {
        get_variance(&(vt.part_variances)->none);
        bVar6 = (cpi->common).current_frame.frame_type;
      }
      if ((bVar6 & 0xfd) == 0) {
        if (BLOCK_32X32 < bsize) {
          return 0;
        }
        if (threshold * 0x10 < (long)((vt.part_variances)->none).variance) {
          return 0;
        }
      }
      if (tile->mi_col_end < iVar7) {
        iVar8 = tile->mi_row_end;
      }
      else {
        iVar8 = tile->mi_row_end;
        if (((int)(uVar5 + mi_row) <= iVar8) && (((vt.part_variances)->none).variance < threshold))
        goto LAB_002342d1;
      }
      if (((int)(uVar5 + mi_row) <= iVar8) && ((int)(uVar12 + mi_col) <= tile->mi_col_end)) {
        bsize_00 = get_partition_subsize(bsize,'\x02');
        pVVar3 = vt.part_variances;
        BVar2 = av1_ss_size_lookup[bsize_00][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y]
        ;
        get_variance((vt.part_variances)->vert);
        get_variance(pVVar3->vert + 1);
        if ((pVVar3->vert[0].variance < threshold) &&
           ((pVVar3->vert[1].variance < threshold && (BVar2 != BLOCK_INVALID)))) {
          set_block_size(cpi,mi_row,mi_col,bsize_00);
          mi_col = uVar11 + mi_col;
          bsize = bsize_00;
          goto LAB_002342d1;
        }
      }
      if (tile->mi_col_end < iVar7) {
        return 0;
      }
      if (tile->mi_row_end < (int)(local_84 + mi_row)) {
        return 0;
      }
      bsize = get_partition_subsize(bsize,'\x01');
      BVar2 = av1_ss_size_lookup[bsize][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y];
      get_variance((vt.part_variances)->horz);
      get_variance((vt.part_variances)->horz + 1);
      if (threshold <= (vt.part_variances)->horz[0].variance) {
        return 0;
      }
      if (threshold <= (vt.part_variances)->horz[1].variance) {
        return 0;
      }
      if (BVar2 == BLOCK_INVALID) {
        return 0;
      }
      set_block_size(cpi,mi_row,mi_col,bsize);
      mi_row = uVar9 + mi_row;
    }
  }
LAB_002342d1:
  set_block_size(cpi,mi_row,mi_col,bsize);
  return 1;
}

Assistant:

static int set_vt_partitioning(AV1_COMP *cpi, MACROBLOCKD *const xd,
                               const TileInfo *const tile, void *data,
                               BLOCK_SIZE bsize, int mi_row, int mi_col,
                               int64_t threshold, BLOCK_SIZE bsize_min,
                               PART_EVAL_STATUS force_split) {
  AV1_COMMON *const cm = &cpi->common;
  variance_node vt;
  const int block_width = mi_size_wide[bsize];
  const int block_height = mi_size_high[bsize];
  int bs_width_check = block_width;
  int bs_height_check = block_height;
  int bs_width_vert_check = block_width >> 1;
  int bs_height_horiz_check = block_height >> 1;
  // On the right and bottom boundary we only need to check
  // if half the bsize fits, because boundary is extended
  // up to 64. So do this check only for sb_size = 64X64.
  if (cm->seq_params->sb_size == BLOCK_64X64) {
    if (tile->mi_col_end == cm->mi_params.mi_cols) {
      bs_width_check = (block_width >> 1) + 1;
      bs_width_vert_check = (block_width >> 2) + 1;
    }
    if (tile->mi_row_end == cm->mi_params.mi_rows) {
      bs_height_check = (block_height >> 1) + 1;
      bs_height_horiz_check = (block_height >> 2) + 1;
    }
  }

  assert(block_height == block_width);
  tree_to_node(data, bsize, &vt);

  if (mi_col + bs_width_check <= tile->mi_col_end &&
      mi_row + bs_height_check <= tile->mi_row_end &&
      force_split == PART_EVAL_ONLY_NONE) {
    set_block_size(cpi, mi_row, mi_col, bsize);
    return 1;
  }
  if (force_split == PART_EVAL_ONLY_SPLIT) return 0;

  // For bsize=bsize_min (16x16/8x8 for 8x8/4x4 downsampling), select if
  // variance is below threshold, otherwise split will be selected.
  // No check for vert/horiz split as too few samples for variance.
  if (bsize == bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    return 0;
  } else if (bsize > bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    // For key frame: take split for bsize above 32X32 or very high variance.
    if (frame_is_intra_only(cm) &&
        (bsize > BLOCK_32X32 ||
         vt.part_variances->none.variance > (threshold << 4))) {
      return 0;
    }
    // If variance is low, take the bsize (no split).
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    // Check vertical split.
    if (mi_row + bs_height_check <= tile->mi_row_end &&
        mi_col + bs_width_vert_check <= tile->mi_col_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_VERT);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->vert[0]);
      get_variance(&vt.part_variances->vert[1]);
      if (vt.part_variances->vert[0].variance < threshold &&
          vt.part_variances->vert[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row, mi_col + block_width / 2, subsize);
        return 1;
      }
    }
    // Check horizontal split.
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_horiz_check <= tile->mi_row_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->horz[0]);
      get_variance(&vt.part_variances->horz[1]);
      if (vt.part_variances->horz[0].variance < threshold &&
          vt.part_variances->horz[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row + block_height / 2, mi_col, subsize);
        return 1;
      }
    }
    return 0;
  }
  return 0;
}